

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

int filter_lookup(filter **filt,kqueue *kq,short id)

{
  int *piVar1;
  ushort in_DX;
  long in_RSI;
  long *in_RDI;
  undefined4 local_4;
  
  if (((short)(in_DX ^ 0xffff) < 0) || (0xb < (short)(in_DX ^ 0xffff))) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    *in_RDI = 0;
    local_4 = -1;
  }
  else {
    *in_RDI = in_RSI + 0x18 + (long)(int)((int)(short)in_DX ^ 0xffffffff) * 0xa0;
    if (*(long *)(*in_RDI + 0x30) == 0) {
      piVar1 = __errno_location();
      *piVar1 = 0x26;
      *in_RDI = 0;
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
filter_lookup(struct filter **filt, struct kqueue *kq, short id)
{
    if (~id < 0 || ~id >= EVFILT_SYSCOUNT) {
        dbg_printf("filt=%d inv_filt=%d - invalid id", id, (~id));
        errno = EINVAL;
        *filt = NULL;
        return (-1);
    }
    *filt = &kq->kq_filt[~id];
    if ((*filt)->kf_copyout == NULL) {
        dbg_printf("filt=%d - filt_name=%s not implemented", id, filter_name(id));
        errno = ENOSYS;
        *filt = NULL;
        return (-1);
    }

    return (0);
}